

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O3

void Msat_SolverClaRescaleActivity(Msat_Solver_t *p)

{
  uint uVar1;
  Msat_Clause_t **ppMVar2;
  ulong uVar3;
  float fVar4;
  
  uVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar2 = Msat_ClauseVecReadArray(p->vLearned);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      fVar4 = Msat_ClauseReadActivity(ppMVar2[uVar3]);
      Msat_ClauseWriteActivity(ppMVar2[uVar3],fVar4 * 1e-20);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  p->dClaInc = p->dClaInc * 1e-20;
  return;
}

Assistant:

void Msat_SolverClaRescaleActivity( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;
    float Activ;
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        Activ = Msat_ClauseReadActivity( pLearned[i] );
        Msat_ClauseWriteActivity( pLearned[i], Activ * (float)1e-20 );
    }
    p->dClaInc *= 1e-20;
}